

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParseCharClass(xmlRegParserCtxtPtr ctxt)

{
  xmlRegAtomPtr pxVar1;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (*ctxt->cur == '[') {
    ctxt->cur = ctxt->cur + 1;
    pxVar1 = xmlRegNewAtom(ctxt,XML_REGEXP_RANGES);
    ctxt->atom = pxVar1;
    if (ctxt->atom != (xmlRegAtomPtr)0x0) {
      xmlFAParseCharGroup(ctxt);
      if (*ctxt->cur == ']') {
        ctxt->cur = ctxt->cur + 1;
      }
      else {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"xmlFAParseCharClass: \']\' expected");
      }
    }
  }
  else {
    xmlFAParseCharClassEsc(ctxt);
  }
  return;
}

Assistant:

static void
xmlFAParseCharClass(xmlRegParserCtxtPtr ctxt) {
    if (CUR == '[') {
	NEXT;
	ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_RANGES);
	if (ctxt->atom == NULL)
	    return;
	xmlFAParseCharGroup(ctxt);
	if (CUR == ']') {
	    NEXT;
	} else {
	    ERROR("xmlFAParseCharClass: ']' expected");
	}
    } else {
	xmlFAParseCharClassEsc(ctxt);
    }
}